

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

int evsig_restore_handler_(event_base *base,int evsignal)

{
  sigaction **ppsVar1;
  sigaction *__act;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  if (evsignal < (base->sig).sh_old_max) {
    ppsVar1 = (base->sig).sh_old;
    __act = ppsVar1[evsignal];
    ppsVar1[evsignal] = (sigaction *)0x0;
    iVar3 = 0;
    iVar2 = sigaction(evsignal,(sigaction *)__act,(sigaction *)0x0);
    if (iVar2 == -1) {
      event_warn("sigaction");
      iVar3 = -1;
    }
    event_mm_free_(__act);
  }
  return iVar3;
}

Assistant:

int
evsig_restore_handler_(struct event_base *base, int evsignal)
{
	int ret = 0;
	struct evsig_info *sig = &base->sig;
#ifdef EVENT__HAVE_SIGACTION
	struct sigaction *sh;
#else
	ev_sighandler_t *sh;
#endif

	if (evsignal >= sig->sh_old_max) {
		/* Can't actually restore. */
		/* XXXX.*/
		return 0;
	}

	/* restore previous handler */
	sh = sig->sh_old[evsignal];
	sig->sh_old[evsignal] = NULL;
#ifdef EVENT__HAVE_SIGACTION
	if (sigaction(evsignal, sh, NULL) == -1) {
		event_warn("sigaction");
		ret = -1;
	}
#else
	if (signal(evsignal, *sh) == SIG_ERR) {
		event_warn("signal");
		ret = -1;
	}
#endif

	mm_free(sh);

	return ret;
}